

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lysp_type_dup(ly_ctx *ctx,lysp_module *pmod,lysp_type *orig_type,lysp_type *type)

{
  lysp_ext_instance **pplVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  lysp_restr *plVar4;
  lysp_type_enum *plVar5;
  lysp_type_enum *plVar6;
  char **ppcVar7;
  char **ppcVar8;
  char **ppcVar9;
  lysp_type *plVar10;
  lysp_type *plVar11;
  LY_ERR LVar12;
  lysp_restr *plVar13;
  long *plVar14;
  lysp_ext_instance *plVar15;
  ulong uVar16;
  lysp_ext_instance *plVar17;
  char *pcVar18;
  size_t sVar19;
  LY_ERR unaff_EBP;
  char *pcVar20;
  lysp_ext_instance *plVar21;
  ulong uVar22;
  long lVar23;
  lysp_ext_instance *plVar24;
  bool bVar25;
  
  type->pmod = (lysp_module *)0x0;
  type->compiled = (lysc_type *)0x0;
  type->types = (lysp_type *)0x0;
  type->exts = (lysp_ext_instance *)0x0;
  type->path = (lyxp_expr *)0x0;
  type->bases = (char **)0x0;
  type->enums = (lysp_type_enum *)0x0;
  type->bits = (lysp_type_enum *)0x0;
  type->length = (lysp_restr *)0x0;
  type->patterns = (lysp_restr *)0x0;
  type->name = (char *)0x0;
  type->range = (lysp_restr *)0x0;
  type->fraction_digits = '\0';
  type->require_instance = '\0';
  type->flags = 0;
  *(undefined4 *)&type->field_0x64 = 0;
  LVar12 = lydict_dup(ctx,orig_type->name,&type->name);
  if (LVar12 != LY_SUCCESS) {
    return LVar12;
  }
  if (orig_type->range == (lysp_restr *)0x0) {
LAB_001545a6:
    if (orig_type->length != (lysp_restr *)0x0) {
      plVar13 = (lysp_restr *)calloc(1,0x40);
      type->length = plVar13;
      if (plVar13 == (lysp_restr *)0x0) goto LAB_0015461c;
      LVar12 = lysp_restr_dup(ctx,pmod,orig_type->length,plVar13);
      if (LVar12 != LY_SUCCESS) {
        return LVar12;
      }
    }
    plVar13 = orig_type->patterns;
    if (plVar13 != (lysp_restr *)0x0) {
      plVar4 = type->patterns;
      if (plVar4 == (lysp_restr *)0x0) {
        plVar14 = (long *)calloc(1,(long)plVar13[-1].exts << 6 | 8);
      }
      else {
        plVar14 = (long *)realloc(&plVar4[-1].exts,
                                  ((long)&(plVar4[-1].exts)->name + (long)&(plVar13[-1].exts)->name)
                                  * 0x40 | 8);
      }
      if (plVar14 == (long *)0x0) {
        bVar25 = false;
        unaff_EBP = LY_EMEM;
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
      }
      else {
        type->patterns = (lysp_restr *)(plVar14 + 1);
        if (orig_type->patterns == (lysp_restr *)0x0) {
          sVar19 = 0;
        }
        else {
          sVar19 = (long)orig_type->patterns[-1].exts << 6;
        }
        memset(plVar14 + *plVar14 * 8 + 1,0,sVar19);
        bVar25 = true;
      }
      if (bVar25) {
        plVar21 = (lysp_ext_instance *)0xffffffffffffffff;
        lVar23 = 0;
        do {
          plVar13 = orig_type->patterns;
          if (plVar13 == (lysp_restr *)0x0) {
            plVar15 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar15 = plVar13[-1].exts;
          }
          plVar21 = (lysp_ext_instance *)((long)&plVar21->name + 1);
          bVar25 = plVar15 <= plVar21;
          LVar12 = unaff_EBP;
          if (bVar25) break;
          plVar4 = type->patterns;
          pplVar1 = &plVar4[-1].exts;
          *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
          LVar12 = lysp_restr_dup(ctx,pmod,(lysp_restr *)((long)&(plVar13->arg).str + lVar23),
                                  (lysp_restr *)((long)&(plVar4->arg).str + lVar23));
          lVar23 = lVar23 + 0x40;
        } while (LVar12 == LY_SUCCESS);
      }
      else {
        bVar25 = false;
        LVar12 = unaff_EBP;
      }
      unaff_EBP = LVar12;
      if (!bVar25) {
        return unaff_EBP;
      }
    }
    plVar5 = orig_type->enums;
    if (plVar5 != (lysp_type_enum *)0x0) {
      plVar6 = type->enums;
      if (plVar6 == (lysp_type_enum *)0x0) {
        plVar14 = (long *)calloc(1,*(long *)&plVar5[-1].flags * 0x38 + 8);
      }
      else {
        plVar14 = (long *)realloc(&plVar6[-1].flags,
                                  (*(long *)&plVar5[-1].flags + *(long *)&plVar6[-1].flags) * 0x38 +
                                  8);
      }
      if (plVar14 == (long *)0x0) {
        bVar25 = false;
        unaff_EBP = LY_EMEM;
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
      }
      else {
        type->enums = (lysp_type_enum *)(plVar14 + 1);
        if (orig_type->enums == (lysp_type_enum *)0x0) {
          sVar19 = 0;
        }
        else {
          sVar19 = *(long *)&orig_type->enums[-1].flags * 0x38;
        }
        memset(plVar14 + *plVar14 * 7 + 1,0,sVar19);
        bVar25 = true;
      }
      if (bVar25) {
        uVar22 = 0xffffffffffffffff;
        lVar23 = 0;
        do {
          plVar5 = orig_type->enums;
          if (plVar5 == (lysp_type_enum *)0x0) {
            uVar16 = 0;
          }
          else {
            uVar16 = *(ulong *)&plVar5[-1].flags;
          }
          uVar22 = uVar22 + 1;
          bVar25 = uVar16 <= uVar22;
          LVar12 = unaff_EBP;
          if (bVar25) break;
          plVar6 = type->enums;
          puVar2 = &plVar6[-1].flags;
          *(long *)puVar2 = *(long *)puVar2 + 1;
          LVar12 = lysp_type_enum_dup(ctx,pmod,(lysp_type_enum *)((long)&plVar5->name + lVar23),
                                      (lysp_type_enum *)((long)&plVar6->name + lVar23));
          lVar23 = lVar23 + 0x38;
        } while (LVar12 == LY_SUCCESS);
      }
      else {
        bVar25 = false;
        LVar12 = unaff_EBP;
      }
      unaff_EBP = LVar12;
      if (!bVar25) {
        return unaff_EBP;
      }
    }
    plVar5 = orig_type->bits;
    if (plVar5 != (lysp_type_enum *)0x0) {
      plVar6 = type->bits;
      if (plVar6 == (lysp_type_enum *)0x0) {
        plVar14 = (long *)calloc(1,*(long *)&plVar5[-1].flags * 0x38 + 8);
      }
      else {
        plVar14 = (long *)realloc(&plVar6[-1].flags,
                                  (*(long *)&plVar5[-1].flags + *(long *)&plVar6[-1].flags) * 0x38 +
                                  8);
      }
      if (plVar14 == (long *)0x0) {
        bVar25 = false;
        unaff_EBP = LY_EMEM;
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
      }
      else {
        type->bits = (lysp_type_enum *)(plVar14 + 1);
        if (orig_type->bits == (lysp_type_enum *)0x0) {
          sVar19 = 0;
        }
        else {
          sVar19 = *(long *)&orig_type->bits[-1].flags * 0x38;
        }
        memset(plVar14 + *plVar14 * 7 + 1,0,sVar19);
        bVar25 = true;
      }
      if (bVar25) {
        uVar22 = 0xffffffffffffffff;
        lVar23 = 0;
        do {
          plVar5 = orig_type->bits;
          if (plVar5 == (lysp_type_enum *)0x0) {
            uVar16 = 0;
          }
          else {
            uVar16 = *(ulong *)&plVar5[-1].flags;
          }
          uVar22 = uVar22 + 1;
          bVar25 = uVar16 <= uVar22;
          LVar12 = unaff_EBP;
          if (bVar25) break;
          plVar6 = type->bits;
          puVar2 = &plVar6[-1].flags;
          *(long *)puVar2 = *(long *)puVar2 + 1;
          LVar12 = lysp_type_enum_dup(ctx,pmod,(lysp_type_enum *)((long)&plVar5->name + lVar23),
                                      (lysp_type_enum *)((long)&plVar6->name + lVar23));
          lVar23 = lVar23 + 0x38;
        } while (LVar12 == LY_SUCCESS);
      }
      else {
        bVar25 = false;
        LVar12 = unaff_EBP;
      }
      unaff_EBP = LVar12;
      if (!bVar25) {
        return unaff_EBP;
      }
    }
    LVar12 = lyxp_expr_dup(ctx,orig_type->path,0,0,&type->path);
    if (LVar12 == LY_SUCCESS) {
      ppcVar7 = orig_type->bases;
      if (ppcVar7 != (char **)0x0) {
        ppcVar8 = type->bases;
        if (ppcVar8 == (char **)0x0) {
          plVar14 = (long *)calloc(1,(long)ppcVar7[-1] * 8 + 8);
        }
        else {
          plVar14 = (long *)realloc(ppcVar8 + -1,(long)(ppcVar7[-1] + (long)ppcVar8[-1]) * 8 + 8);
        }
        if (plVar14 == (long *)0x0) {
          bVar25 = false;
          unaff_EBP = LY_EMEM;
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
        }
        else {
          type->bases = (char **)(plVar14 + 1);
          if (orig_type->bases == (char **)0x0) {
            sVar19 = 0;
          }
          else {
            sVar19 = (long)orig_type->bases[-1] << 3;
          }
          memset(plVar14 + *plVar14 + 1,0,sVar19);
          bVar25 = true;
        }
        if (bVar25) {
          lVar23 = 0;
          pcVar20 = (char *)0x0;
          do {
            ppcVar7 = orig_type->bases;
            if (ppcVar7 == (char **)0x0) {
              pcVar18 = (char *)0x0;
            }
            else {
              pcVar18 = ppcVar7[-1];
            }
            bVar25 = pcVar18 <= pcVar20;
            LVar12 = unaff_EBP;
            if (bVar25) break;
            ppcVar9 = type->bases;
            ppcVar8 = ppcVar9 + -1;
            *ppcVar8 = *ppcVar8 + 1;
            LVar12 = lydict_dup(ctx,*(char **)((long)ppcVar7 + lVar23),
                                (char **)((long)ppcVar9 + lVar23));
            pcVar20 = pcVar20 + 1;
            lVar23 = lVar23 + 8;
          } while (LVar12 == LY_SUCCESS);
        }
        else {
          bVar25 = false;
          LVar12 = unaff_EBP;
        }
        unaff_EBP = LVar12;
        if (!bVar25) {
          return unaff_EBP;
        }
      }
      plVar10 = orig_type->types;
      if (plVar10 != (lysp_type *)0x0) {
        plVar11 = type->types;
        if (plVar11 == (lysp_type *)0x0) {
          plVar14 = (long *)calloc(1,*(long *)&plVar10[-1].fraction_digits * 0x68 + 8);
        }
        else {
          plVar14 = (long *)realloc(&plVar11[-1].fraction_digits,
                                    (*(long *)&plVar10[-1].fraction_digits +
                                    *(long *)&plVar11[-1].fraction_digits) * 0x68 + 8);
        }
        if (plVar14 == (long *)0x0) {
          bVar25 = false;
          unaff_EBP = LY_EMEM;
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
        }
        else {
          type->types = (lysp_type *)(plVar14 + 1);
          if (orig_type->types == (lysp_type *)0x0) {
            sVar19 = 0;
          }
          else {
            sVar19 = *(long *)&orig_type->types[-1].fraction_digits * 0x68;
          }
          memset(plVar14 + *plVar14 * 0xd + 1,0,sVar19);
          bVar25 = true;
        }
        if (bVar25) {
          uVar22 = 0xffffffffffffffff;
          lVar23 = 0;
          do {
            plVar10 = orig_type->types;
            if (plVar10 == (lysp_type *)0x0) {
              uVar16 = 0;
            }
            else {
              uVar16._0_1_ = plVar10[-1].fraction_digits;
              uVar16._1_1_ = plVar10[-1].require_instance;
              uVar16._2_2_ = plVar10[-1].flags;
              uVar16._4_4_ = *(undefined4 *)&plVar10[-1].field_0x64;
            }
            uVar22 = uVar22 + 1;
            bVar25 = uVar16 <= uVar22;
            LVar12 = unaff_EBP;
            if (bVar25) break;
            plVar11 = type->types;
            puVar3 = &plVar11[-1].fraction_digits;
            *(long *)puVar3 = *(long *)puVar3 + 1;
            LVar12 = lysp_type_dup(ctx,pmod,(lysp_type *)((long)&plVar10->name + lVar23),
                                   (lysp_type *)((long)&plVar11->name + lVar23));
            lVar23 = lVar23 + 0x68;
          } while (LVar12 == LY_SUCCESS);
        }
        else {
          bVar25 = false;
          LVar12 = unaff_EBP;
        }
        unaff_EBP = LVar12;
        if (!bVar25) {
          return unaff_EBP;
        }
      }
      plVar21 = orig_type->exts;
      if (plVar21 != (lysp_ext_instance *)0x0) {
        plVar15 = type->exts;
        if (plVar15 == (lysp_ext_instance *)0x0) {
          plVar24 = (lysp_ext_instance *)0x0;
          plVar14 = (long *)calloc(1,(long)plVar21[-1].exts * 0x70 | 8);
        }
        else {
          plVar24 = plVar15[-1].exts;
          plVar14 = (long *)realloc(&plVar15[-1].exts,
                                    ((long)&(plVar15[-1].exts)->name +
                                    (long)&(plVar21[-1].exts)->name) * 0x70 | 8);
        }
        if (plVar14 == (long *)0x0) {
          bVar25 = false;
          unaff_EBP = LY_EMEM;
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
        }
        else {
          type->exts = (lysp_ext_instance *)(plVar14 + 1);
          if (orig_type->exts == (lysp_ext_instance *)0x0) {
            sVar19 = 0;
          }
          else {
            sVar19 = (long)orig_type->exts[-1].exts * 0x70;
          }
          memset(plVar14 + *plVar14 * 0xe + 1,0,sVar19);
          bVar25 = true;
        }
        if (bVar25) {
          plVar21 = (lysp_ext_instance *)0xffffffffffffffff;
          lVar23 = 0;
          do {
            plVar15 = orig_type->exts;
            if (plVar15 == (lysp_ext_instance *)0x0) {
              plVar17 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar17 = plVar15[-1].exts;
            }
            plVar21 = (lysp_ext_instance *)((long)&plVar21->name + 1);
            bVar25 = plVar17 <= plVar21;
            LVar12 = unaff_EBP;
            if (bVar25) break;
            plVar17 = type->exts;
            pplVar1 = &plVar17[-1].exts;
            *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
            LVar12 = lysp_ext_dup(ctx,pmod,type,LY_STMT_TYPE,
                                  (lysp_ext_instance *)((long)&plVar15->name + lVar23),
                                  (lysp_ext_instance *)((long)&plVar17[(long)plVar24].name + lVar23)
                                 );
            lVar23 = lVar23 + 0x70;
          } while (LVar12 == LY_SUCCESS);
        }
        else {
          bVar25 = false;
          LVar12 = unaff_EBP;
        }
        if (!bVar25) {
          return LVar12;
        }
      }
      type->pmod = orig_type->pmod;
      type->compiled = orig_type->compiled;
      type->fraction_digits = orig_type->fraction_digits;
      type->require_instance = orig_type->require_instance;
      type->flags = orig_type->flags;
      LVar12 = LY_SUCCESS;
    }
  }
  else {
    plVar13 = (lysp_restr *)calloc(1,0x40);
    type->range = plVar13;
    if (plVar13 != (lysp_restr *)0x0) {
      unaff_EBP = lysp_restr_dup(ctx,pmod,orig_type->range,plVar13);
      if (unaff_EBP != LY_SUCCESS) {
        return unaff_EBP;
      }
      goto LAB_001545a6;
    }
LAB_0015461c:
    LVar12 = LY_EMEM;
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
  }
  return LVar12;
}

Assistant:

static LY_ERR
lysp_type_dup(const struct ly_ctx *ctx, const struct lysp_module *pmod, const struct lysp_type *orig_type,
        struct lysp_type *type)
{
    LY_ERR ret = LY_SUCCESS;

    /* array macros read previous data so we must zero it */
    memset(type, 0, sizeof *type);

    DUP_STRING_GOTO(ctx, orig_type->name, type->name, ret, done);

    if (orig_type->range) {
        type->range = calloc(1, sizeof *type->range);
        LY_CHECK_ERR_RET(!type->range, LOGMEM(ctx), LY_EMEM);
        LY_CHECK_RET(lysp_restr_dup(ctx, pmod, orig_type->range, type->range));
    }

    if (orig_type->length) {
        type->length = calloc(1, sizeof *type->length);
        LY_CHECK_ERR_RET(!type->length, LOGMEM(ctx), LY_EMEM);
        LY_CHECK_RET(lysp_restr_dup(ctx, pmod, orig_type->length, type->length));
    }

    DUP_ARRAY2(ctx, pmod, orig_type->patterns, type->patterns, lysp_restr_dup);
    DUP_ARRAY2(ctx, pmod, orig_type->enums, type->enums, lysp_type_enum_dup);
    DUP_ARRAY2(ctx, pmod, orig_type->bits, type->bits, lysp_type_enum_dup);
    LY_CHECK_GOTO(ret = lyxp_expr_dup(ctx, orig_type->path, 0, 0, &type->path), done);
    DUP_ARRAY(ctx, orig_type->bases, type->bases, lysp_string_dup);
    DUP_ARRAY2(ctx, pmod, orig_type->types, type->types, lysp_type_dup);
    DUP_EXTS(ctx, pmod, type, LY_STMT_TYPE, orig_type->exts, type->exts, lysp_ext_dup);

    type->pmod = orig_type->pmod;
    type->compiled = orig_type->compiled;

    type->fraction_digits = orig_type->fraction_digits;
    type->require_instance = orig_type->require_instance;
    type->flags = orig_type->flags;

done:
    return ret;
}